

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

bool __thiscall
booster::locale::gnu_gettext::mo_message<char>::load_file
          (mo_message<char> *this,string *file_name,string *locale_encoding,string *key_encoding,
          int id,callback_type *callback)

{
  pointer file;
  bool bVar1;
  int iVar2;
  mo_file *pmVar3;
  char *__s;
  size_t sVar4;
  mapped_type *pmVar5;
  runtime_error *this_00;
  uint id_00;
  pair_type pVar6;
  unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
  mo;
  vector<char,_std::allocator<char>_> vfile;
  string mo_encoding;
  converter<char> cvt_value;
  string plural;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string_type skey;
  converter<char> cvt_key;
  string_type value;
  
  std::__cxx11::string::_M_assign((string *)&this->locale_encoding_);
  std::__cxx11::string::_M_assign((string *)&this->key_encoding_);
  iVar2 = compare_encodings(this,locale_encoding,key_encoding);
  this->key_conversion_required_ = iVar2 != 0;
  mo._M_t.
  super___uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
  ._M_t.
  super__Tuple_impl<0UL,_booster::locale::gnu_gettext::mo_file_*,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
  .super__Head_base<0UL,_booster::locale::gnu_gettext::mo_file_*,_false>._M_head_impl =
       (__uniq_ptr_data<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>,_true,_true>
        )(__uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
          )0x0;
  if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
    vfile.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    c_file::open((c_file *)&vfile,(char *)file_name,(int)locale_encoding);
    file = vfile.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
    if (vfile.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) {
      c_file::~c_file((c_file *)&vfile);
      goto LAB_00185637;
    }
    pmVar3 = (mo_file *)operator_new(0x48);
    mo_file::mo_file(pmVar3,(FILE *)file);
    std::
    __uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
    ::reset((__uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
             *)&mo,pmVar3);
    c_file::~c_file((c_file *)&vfile);
  }
  else {
    std::
    function<std::vector<char,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&vfile,callback,file_name,locale_encoding);
    if (vfile.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        vfile.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&vfile.super__Vector_base<char,_std::allocator<char>_>);
LAB_00185637:
      bVar1 = false;
      goto LAB_00185639;
    }
    pmVar3 = (mo_file *)operator_new(0x48);
    mo_file::mo_file(pmVar3,&vfile);
    std::
    __uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
    ::reset((__uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
             *)&mo,pmVar3);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&vfile.super__Vector_base<char,_std::allocator<char>_>);
  }
  pVar6 = mo_file::value((mo_file *)
                         mo._M_t.
                         super___uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_booster::locale::gnu_gettext::mo_file_*,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                         .super__Head_base<0UL,_booster::locale::gnu_gettext::mo_file_*,_false>.
                         _M_head_impl,0);
  std::__cxx11::string::string((string *)&vfile,pVar6.first,(allocator *)&cvt_key);
  std::__cxx11::string::string((string *)&cvt_value,"plural=",(allocator *)&mo_encoding);
  extract(&plural,(string *)&vfile,&cvt_value.out_,"\r\n;");
  std::__cxx11::string::~string((string *)&cvt_value);
  std::__cxx11::string::~string((string *)&vfile);
  pVar6 = mo_file::value((mo_file *)
                         mo._M_t.
                         super___uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_booster::locale::gnu_gettext::mo_file_*,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                         .super__Head_base<0UL,_booster::locale::gnu_gettext::mo_file_*,_false>.
                         _M_head_impl,0);
  std::__cxx11::string::string((string *)&vfile,pVar6.first,(allocator *)&cvt_key);
  std::__cxx11::string::string((string *)&cvt_value,"charset=",(allocator *)&skey);
  extract(&mo_encoding,(string *)&vfile,&cvt_value.out_," \r\n;");
  std::__cxx11::string::~string((string *)&cvt_value);
  std::__cxx11::string::~string((string *)&vfile);
  if (mo_encoding._M_string_length == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&vfile,"Invalid mo-format, encoding is not specified",
               (allocator *)&cvt_value);
    runtime_error::runtime_error(this_00,(string *)&vfile);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  if (plural._M_string_length != 0) {
    lambda::compile((lambda *)&vfile,plural._M_dataplus._M_p);
    std::__shared_ptr<booster::locale::gnu_gettext::lambda::plural,(__gnu_cxx::_Lock_policy)2>::
    operator=((__shared_ptr<booster::locale::gnu_gettext::lambda::plural,(__gnu_cxx::_Lock_policy)2>
               *)((this->plural_forms_).
                  super__Vector_base<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + id),
              (unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
               *)&vfile);
    if (vfile.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      (**(code **)(*(long *)vfile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start + 0x18))();
    }
  }
  bVar1 = mo_useable_directly(this,&mo_encoding,
                              (mo_file *)
                              mo._M_t.
                              super___uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_booster::locale::gnu_gettext::mo_file_*,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                              .super__Head_base<0UL,_booster::locale::gnu_gettext::mo_file_*,_false>
                              ._M_head_impl);
  if (bVar1) {
    std::__shared_ptr<booster::locale::gnu_gettext::mo_file,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<booster::locale::gnu_gettext::mo_file,(__gnu_cxx::_Lock_policy)2> *)
               ((this->mo_catalogs_).
                super__Vector_base<std::shared_ptr<booster::locale::gnu_gettext::mo_file>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::mo_file>_>_>
                ._M_impl.super__Vector_impl_data._M_start + id),&mo);
  }
  else {
    std::__cxx11::string::string((string *)&local_d0,(string *)locale_encoding);
    std::__cxx11::string::string((string *)&local_f0,(string *)&mo_encoding);
    converter<char>::converter(&cvt_value,&local_d0,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string((string *)&local_110,(string *)key_encoding);
    std::__cxx11::string::string((string *)&local_130,(string *)&mo_encoding);
    converter<char>::converter(&cvt_key,&local_110,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    for (id_00 = 0;
        (ulong)id_00 <
        *(ulong *)((long)mo._M_t.
                         super___uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_booster::locale::gnu_gettext::mo_file_*,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                         .super__Head_base<0UL,_booster::locale::gnu_gettext::mo_file_*,_false>.
                         _M_head_impl + 0x40); id_00 = id_00 + 1) {
      __s = mo_file::key((mo_file *)
                         mo._M_t.
                         super___uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_booster::locale::gnu_gettext::mo_file_*,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                         .super__Head_base<0UL,_booster::locale::gnu_gettext::mo_file_*,_false>.
                         _M_head_impl,id_00);
      sVar4 = strlen(__s);
      converter<char>::operator()[abi_cxx11_(&skey,&cvt_key,__s,__s + sVar4);
      message_key<char>::message_key((message_key<char> *)&vfile,&skey);
      pVar6 = mo_file::value((mo_file *)
                             mo._M_t.
                             super___uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_booster::locale::gnu_gettext::mo_file_*,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                             .super__Head_base<0UL,_booster::locale::gnu_gettext::mo_file_*,_false>.
                             _M_head_impl,id_00);
      converter<char>::operator()[abi_cxx11_(&value,&cvt_value,pVar6.first,pVar6.second);
      pmVar5 = std::
               map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((this->catalogs_).
                            super__Vector_base<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + id,
                            (message_key<char> *)&vfile);
      std::__cxx11::string::swap((string *)pmVar5);
      std::__cxx11::string::~string((string *)&value);
      message_key<char>::~message_key((message_key<char> *)&vfile);
      std::__cxx11::string::~string((string *)&skey);
    }
    converter<char>::~converter(&cvt_key);
    converter<char>::~converter(&cvt_value);
  }
  std::__cxx11::string::~string((string *)&mo_encoding);
  std::__cxx11::string::~string((string *)&plural);
  bVar1 = true;
LAB_00185639:
  std::
  unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
  ::~unique_ptr(&mo);
  return bVar1;
}

Assistant:

bool load_file( std::string const &file_name,
                                std::string const &locale_encoding,
                                std::string const &key_encoding,
                                int id,
                                messages_info::callback_type const &callback)
                {
                    locale_encoding_ = locale_encoding;
                    key_encoding_ = key_encoding;
                    
                    key_conversion_required_ =  sizeof(CharType) == 1 
                                                && compare_encodings(locale_encoding,key_encoding)!=0;

                    std::unique_ptr<mo_file> mo;

                    if(callback) {
                        std::vector<char> vfile = callback(file_name,locale_encoding);
                        if(vfile.empty()) 
                            return false;
                        mo.reset(new mo_file(vfile));
                    }
                    else {
                        c_file the_file;
                        the_file.open(file_name,locale_encoding);
                        if(!the_file.file)
                            return false;
                        mo.reset(new mo_file(the_file.file));
                    }
                    
                    std::string plural = extract(mo->value(0).first,"plural=","\r\n;");

                    std::string mo_encoding = extract(mo->value(0).first,"charset="," \r\n;");

                    if(mo_encoding.empty())
                        throw booster::runtime_error("Invalid mo-format, encoding is not specified");

                    if(!plural.empty()) {
                        std::unique_ptr<lambda::plural> ptr=lambda::compile(plural.c_str());
                        plural_forms_[id] = std::move(ptr);
                    }

                    if( mo_useable_directly(mo_encoding,*mo) )
                    {
                        mo_catalogs_[id]=std::move(mo);
                    }
                    else {
                        converter<CharType> cvt_value(locale_encoding,mo_encoding);
                        converter<CharType> cvt_key(key_encoding,mo_encoding);
                        for(unsigned i=0;i<mo->size();i++) {
                            char const *ckey = mo->key(i);
                            string_type skey = cvt_key(ckey,ckey+strlen(ckey));
                            key_type key(skey);
                            
                            mo_file::pair_type tmp = mo->value(i);
                            string_type value = cvt_value(tmp.first,tmp.second);
                            catalogs_[id][key].swap(value);
                        }
                    }
                    return true;

                }